

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O2

void __thiscall
SynthWidget::refreshAudioDeviceList(SynthWidget *this,Master *master,AudioDevice *useAudioDevice)

{
  QComboBox *this_00;
  QPushButton *pQVar1;
  bool bVar2;
  AudioDevice **n;
  AudioDevice **value;
  AudioDevice *audioDevice;
  QListIterator<const_AudioDevice_*> audioDeviceIt;
  undefined1 local_b8 [24];
  QListIterator<const_AudioDevice_*> local_a0;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<const_AudioDevice_*> local_50;
  
  QObject::disconnect((QObject *)(this->ui->super_Ui_SynthWidget).audioDeviceComboBox,
                      "2currentIndexChanged(int)",(QObject *)this,
                      "1on_audioDeviceComboBox_currentIndexChanged(int)");
  QComboBox::clear();
  Master::getAudioDevices((QList<const_AudioDevice_*> *)&local_50,master);
  QListIterator<const_AudioDevice_*>::QListIterator
            (&local_a0,(QList<const_AudioDevice_*> *)&local_50);
  QArrayDataPointer<const_AudioDevice_*>::~QArrayDataPointer(&local_50);
  local_b8._8_8_ = &useAudioDevice->name;
  while (local_a0.i.i != (SynthRoute **)(local_a0.c.d.ptr + local_a0.c.d.size)) {
    local_b8._0_8_ = *local_a0.i.i;
    this_00 = (this->ui->super_Ui_SynthWidget).audioDeviceComboBox;
    local_a0.i.i = local_a0.i.i + 1;
    operator+((QString *)&local_80,
              &(*(AudioDriver **)&((SynthRoute *)local_b8._0_8_)->field_0x8)->name,": ");
    operator+((QString *)&local_68,(QString *)&local_80,(QString *)(local_b8._0_8_ + 0x10));
    QVariant::fromValue<AudioDevice_const*>
              ((enable_if_t<std::is_copy_constructible_v<const_AudioDevice_*>,_QVariant> *)&local_50
               ,(QVariant *)local_b8,value);
    QComboBox::addItem(this_00,(QString *)&local_68,(QVariant *)&local_50);
    QVariant::~QVariant((QVariant *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (((useAudioDevice != (AudioDevice *)0x0) &&
        (bVar2 = operator==(&useAudioDevice->driver->id,&(*(AudioDriver **)(local_b8._0_8_ + 8))->id
                           ), bVar2)) &&
       (bVar2 = operator==((QString *)local_b8._8_8_,(QString *)(local_b8._0_8_ + 0x10)), bVar2)) {
      QComboBox::setCurrentIndex((int)(this->ui->super_Ui_SynthWidget).audioDeviceComboBox);
    }
  }
  pQVar1 = (this->ui->super_Ui_SynthWidget).audioPropertiesButton;
  QComboBox::count();
  QWidget::setEnabled(SUB81(pQVar1,0));
  QObject::connect((QObject *)(local_b8 + 0x10),
                   (char *)(this->ui->super_Ui_SynthWidget).audioDeviceComboBox,
                   (QObject *)"2currentIndexChanged(int)",(char *)this,0x1725e6);
  QMetaObject::Connection::~Connection((Connection *)(local_b8 + 0x10));
  QArrayDataPointer<const_AudioDevice_*>::~QArrayDataPointer
            ((QArrayDataPointer<const_AudioDevice_*> *)&local_a0);
  return;
}

Assistant:

void SynthWidget::refreshAudioDeviceList(Master *master, const AudioDevice *useAudioDevice) {
	disconnect(ui->audioDeviceComboBox, SIGNAL(currentIndexChanged(int)), this, SLOT(on_audioDeviceComboBox_currentIndexChanged(int)));
	ui->audioDeviceComboBox->clear();
	int audioDeviceIndex = 0;
	QListIterator<const AudioDevice *> audioDeviceIt(master->getAudioDevices());
	while(audioDeviceIt.hasNext()) {
		const AudioDevice *audioDevice = audioDeviceIt.next();
		ui->audioDeviceComboBox->addItem(audioDevice->driver.name + ": " + audioDevice->name, QVariant::fromValue(audioDevice));
		if (useAudioDevice != NULL && useAudioDevice->driver.id == audioDevice->driver.id
				&& useAudioDevice->name == audioDevice->name) ui->audioDeviceComboBox->setCurrentIndex(audioDeviceIndex);
		audioDeviceIndex++;
	}
	ui->audioPropertiesButton->setEnabled(ui->audioDeviceComboBox->count() != 0);
	connect(ui->audioDeviceComboBox, SIGNAL(currentIndexChanged(int)), SLOT(on_audioDeviceComboBox_currentIndexChanged(int)));
}